

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall
soul::StructuralParser::parseExpression(StructuralParser *this,bool allowAssignment)

{
  StructuralParser *args_1;
  bool bVar1;
  Expression *args_2;
  undefined1 local_f8 [8];
  Context context;
  CompileMessage local_d0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  StructuralParser *local_28;
  Expression *lhs;
  StructuralParser *pSStack_18;
  bool allowAssignment_local;
  StructuralParser *this_local;
  
  lhs._7_1_ = allowAssignment;
  pSStack_18 = this;
  local_28 = (StructuralParser *)parseTernaryOperator(this);
  local_30 = "+=";
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x4ad39b);
  if (bVar1) {
    this_local = (StructuralParser *)
                 parseInPlaceOpExpression(this,(bool)(lhs._7_1_ & 1),(Expression *)local_28,add);
  }
  else {
    local_38 = "-=";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)"-=");
    if (bVar1) {
      this_local = (StructuralParser *)
                   parseInPlaceOpExpression
                             (this,(bool)(lhs._7_1_ & 1),(Expression *)local_28,subtract);
    }
    else {
      local_40 = "*=";
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&this->super_SOULTokeniser,(TokenType)"*=");
      if (bVar1) {
        this_local = (StructuralParser *)
                     parseInPlaceOpExpression
                               (this,(bool)(lhs._7_1_ & 1),(Expression *)local_28,multiply);
      }
      else {
        local_48 = "/=";
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matches(&this->super_SOULTokeniser,(TokenType)"/=");
        if (bVar1) {
          this_local = (StructuralParser *)
                       parseInPlaceOpExpression
                                 (this,(bool)(lhs._7_1_ & 1),(Expression *)local_28,divide);
        }
        else {
          local_50 = "%=";
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matches(&this->super_SOULTokeniser,(TokenType)"%=");
          if (bVar1) {
            this_local = (StructuralParser *)
                         parseInPlaceOpExpression
                                   (this,(bool)(lhs._7_1_ & 1),(Expression *)local_28,modulo);
          }
          else {
            local_58 = "<<=";
            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matches(&this->super_SOULTokeniser,(TokenType)"<<=");
            if (bVar1) {
              this_local = (StructuralParser *)
                           parseInPlaceOpExpression
                                     (this,(bool)(lhs._7_1_ & 1),(Expression *)local_28,leftShift);
            }
            else {
              local_60 = ">>=";
              bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matches(&this->super_SOULTokeniser,(TokenType)0x4d0144);
              if (bVar1) {
                this_local = (StructuralParser *)
                             parseInPlaceOpExpression
                                       (this,(bool)(lhs._7_1_ & 1),(Expression *)local_28,rightShift
                                       );
              }
              else {
                local_68 = ">>>=";
                bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        ::matches(&this->super_SOULTokeniser,(TokenType)">>>=");
                if (bVar1) {
                  this_local = (StructuralParser *)
                               parseInPlaceOpExpression
                                         (this,(bool)(lhs._7_1_ & 1),(Expression *)local_28,
                                          rightShiftUnsigned);
                }
                else {
                  local_70 = "^=";
                  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                          ::matches(&this->super_SOULTokeniser,(TokenType)"^=");
                  if (bVar1) {
                    this_local = (StructuralParser *)
                                 parseInPlaceOpExpression
                                           (this,(bool)(lhs._7_1_ & 1),(Expression *)local_28,
                                            bitwiseXor);
                  }
                  else {
                    local_78 = "&=";
                    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                            ::matches(&this->super_SOULTokeniser,(TokenType)0x4d014c);
                    if (bVar1) {
                      this_local = (StructuralParser *)
                                   parseInPlaceOpExpression
                                             (this,(bool)(lhs._7_1_ & 1),(Expression *)local_28,
                                              bitwiseAnd);
                    }
                    else {
                      local_80 = "|=";
                      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                              ::matches(&this->super_SOULTokeniser,(TokenType)0x4d0150);
                      if (bVar1) {
                        this_local = (StructuralParser *)
                                     parseInPlaceOpExpression
                                               (this,(bool)(lhs._7_1_ & 1),(Expression *)local_28,
                                                bitwiseOr);
                      }
                      else {
                        local_88 = "&&=";
                        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                ::matches(&this->super_SOULTokeniser,(TokenType)"&&=");
                        if (bVar1) {
                          this_local = (StructuralParser *)
                                       parseInPlaceOpExpression
                                                 (this,(bool)(lhs._7_1_ & 1),(Expression *)local_28,
                                                  logicalAnd);
                        }
                        else {
                          local_90 = "||=";
                          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                  ::matches(&this->super_SOULTokeniser,(TokenType)"||=");
                          if (bVar1) {
                            this_local = (StructuralParser *)
                                         parseInPlaceOpExpression
                                                   (this,(bool)(lhs._7_1_ & 1),
                                                    (Expression *)local_28,logicalOr);
                          }
                          else {
                            local_98 = "=";
                            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                    ::matchIf<soul::TokenType>
                                              (&this->super_SOULTokeniser,(TokenType)0x4aecb7);
                            if (bVar1) {
                              if ((lhs._7_1_ & 1) == 0) {
                                Errors::assignmentInsideExpression<>();
                                (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_d0);
                                CompileMessage::~CompileMessage(&local_d0);
                              }
                              getContext((Context *)local_f8,this);
                              args_1 = local_28;
                              args_2 = parseExpression(this,false);
                              this_local = (StructuralParser *)
                                           allocate<soul::AST::Assignment,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&>
                                                     (this,(Context *)local_f8,(Expression *)args_1,
                                                      args_2);
                              AST::Context::~Context((Context *)local_f8);
                            }
                            else {
                              this_local = local_28;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (Expression *)this_local;
}

Assistant:

AST::Expression& parseExpression (bool allowAssignment = false)
    {
        auto& lhs = parseTernaryOperator();

        if (matches (Operator::plusEquals))                 return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::add);
        if (matches (Operator::minusEquals))                return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::subtract);
        if (matches (Operator::timesEquals))                return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::multiply);
        if (matches (Operator::divideEquals))               return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::divide);
        if (matches (Operator::moduloEquals))               return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::modulo);
        if (matches (Operator::leftShiftEquals))            return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::leftShift);
        if (matches (Operator::rightShiftEquals))           return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::rightShift);
        if (matches (Operator::rightShiftUnsignedEquals))   return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::rightShiftUnsigned);
        if (matches (Operator::xorEquals))                  return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::bitwiseXor);
        if (matches (Operator::bitwiseAndEquals))           return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::bitwiseAnd);
        if (matches (Operator::bitwiseOrEquals))            return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::bitwiseOr);
        if (matches (Operator::logicalAndEquals))           return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::logicalAnd);
        if (matches (Operator::logicalOrEquals))            return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::logicalOr);

        if (matchIf (Operator::assign))
        {
            if (! allowAssignment)
                throwError (Errors::assignmentInsideExpression());

            auto context = getContext();
            return allocate<AST::Assignment> (context, lhs, parseExpression());
        }

        return lhs;
    }